

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O3

void Curl_dynhds_free(dynhds *dynhds)

{
  dynhds_entry **ppdVar1;
  size_t i;
  ulong uVar2;
  
  ppdVar1 = dynhds->hds;
  if (ppdVar1 == (dynhds_entry **)0x0) {
    ppdVar1 = (dynhds_entry **)0x0;
  }
  else if (dynhds->hds_len != 0) {
    uVar2 = 0;
    do {
      (*Curl_cfree)(dynhds->hds[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < dynhds->hds_len);
    ppdVar1 = dynhds->hds;
  }
  (*Curl_cfree)(ppdVar1);
  dynhds->strs_len = 0;
  dynhds->hds = (dynhds_entry **)0x0;
  dynhds->hds_len = 0;
  dynhds->hds_allc = 0;
  return;
}

Assistant:

void Curl_dynhds_free(struct dynhds *dynhds)
{
  DEBUGASSERT(dynhds);
  if(dynhds->hds && dynhds->hds_len) {
    size_t i;
    DEBUGASSERT(dynhds->hds);
    for(i = 0; i < dynhds->hds_len; ++i) {
      entry_free(dynhds->hds[i]);
    }
  }
  Curl_safefree(dynhds->hds);
  dynhds->hds_len = dynhds->hds_allc = dynhds->strs_len = 0;
}